

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.cpp
# Opt level: O3

index_type *
booster::locale::boundary::impl_icu::map_direct
          (index_type *__return_storage_ptr__,boundary_type t,BreakIterator *it,int reserve)

{
  pointer *ppbVar1;
  rule_type *prVar2;
  uint uVar3;
  iterator iVar4;
  pointer pbVar5;
  pointer piVar6;
  int iVar7;
  uint uVar8;
  runtime_error *this;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  UErrorCode err;
  vector<int,_std::allocator<int>_> buffer;
  int32_t membuf [8];
  int local_a0;
  allocator local_99;
  string local_98;
  vector<int,_std::allocator<int>_> local_78;
  int local_58 [10];
  
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::reserve(__return_storage_ptr__,(long)reserve);
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length._0_4_ = 0;
  iVar4._M_current =
       (__return_storage_ptr__->
       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::_M_realloc_insert<booster::locale::boundary::break_info>
              (__return_storage_ptr__,iVar4,(break_info *)&local_98);
  }
  else {
    *(undefined4 *)&(iVar4._M_current)->offset = 0;
    *(undefined4 *)((long)&(iVar4._M_current)->offset + 4) = 0;
    (iVar4._M_current)->rule = 0;
    *(uint *)&(iVar4._M_current)->field_0xc = local_98._M_string_length._4_4_;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  (**(code **)(*(long *)it + 0x50))(it);
  do {
    while( true ) {
      iVar7 = (**(code **)(*(long *)it + 0x68))(it);
      if (iVar7 == -1) {
        return __return_storage_ptr__;
      }
      local_98._M_dataplus._M_p = (pointer)(long)iVar7;
      local_98._M_string_length._0_4_ = 0;
      iVar4._M_current =
           (__return_storage_ptr__->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
        ::_M_realloc_insert<booster::locale::boundary::break_info>
                  (__return_storage_ptr__,iVar4,(break_info *)&local_98);
      }
      else {
        (iVar4._M_current)->offset = (size_t)local_98._M_dataplus._M_p;
        *(ulong *)&(iVar4._M_current)->rule = (ulong)local_98._M_string_length._4_4_ << 0x20;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      if (t != character) break;
      prVar2 = &(__return_storage_ptr__->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish[-1].rule;
      *prVar2 = *prVar2 | 0xf;
    }
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_a0 = 0;
    uVar8 = (**(code **)(*(long *)it + 0xa0))(it,local_58,8,&local_a0);
    piVar6 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar12 = local_58;
    if (local_a0 == 0xf) {
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::resize
                (&local_78,(long)(int)uVar8,(value_type_conflict1 *)&local_98);
      uVar8 = (**(code **)(*(long *)it + 0xa0))
                        (it,piVar6,
                         (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2,&local_a0);
      piVar12 = piVar6;
    }
    iVar7 = local_a0;
    if (0 < local_a0) {
      this = (runtime_error *)__cxa_allocate_exception(0x30);
      pcVar9 = (char *)u_errorName_70(iVar7);
      std::__cxx11::string::string((string *)&local_98,pcVar9,&local_99);
      runtime_error::runtime_error(this,&local_98);
      __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (0 < (int)uVar8) {
      pbVar5 = (__return_storage_ptr__->
               super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = 0;
      do {
        if (t == line) {
          uVar3 = piVar12[uVar10];
joined_r0x0017d900:
          uVar11 = 0xf;
          if ((uVar3 < 100) || (uVar11 = 0xf0, uVar3 - 100 < 100)) {
LAB_0017d90f:
            prVar2 = &pbVar5[-1].rule;
            *prVar2 = *prVar2 | uVar11;
          }
        }
        else {
          if (t == sentence) {
            uVar3 = piVar12[uVar10];
            goto joined_r0x0017d900;
          }
          if (t == word) {
            uVar3 = piVar12[uVar10];
            uVar11 = 0xf;
            if ((((99 < uVar3) && (uVar11 = 0xf0, 99 < uVar3 - 100)) &&
                (uVar11 = 0xf00, 99 < uVar3 - 200)) &&
               ((uVar11 = 0xf000, 99 < uVar3 - 300 && (uVar11 = 0xf0000, 99 < uVar3 - 400))))
            goto LAB_0017d912;
            goto LAB_0017d90f;
          }
        }
LAB_0017d912:
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while( true );
}

Assistant:

index_type map_direct(boundary_type t,icu::BreakIterator *it,int reserve)
{
    index_type indx;
    indx.reserve(reserve);
#if U_ICU_VERSION_MAJOR_NUM >= 52
    icu::BreakIterator *rbbi=it;
#else
    icu::RuleBasedBreakIterator *rbbi=dynamic_cast<icu::RuleBasedBreakIterator *>(it);
#endif
    
    indx.push_back(break_info());
    it->first();
    int pos=0;
    while((pos=it->next())!=icu::BreakIterator::DONE) {
        indx.push_back(break_info(pos));
        /// Character does not have any specific break types
        if(t!=character && rbbi) {
            //
            // There is a collapse for MSVC: int32_t defined by both boost::cstdint and icu...
            // So need to pick one ;(
            //
            std::vector< ::int32_t> buffer;
            ::int32_t membuf[8]={0}; // try not to use memory allocation if possible
            ::int32_t *buf=membuf;

            UErrorCode err=U_ZERO_ERROR;
            int n = rbbi->getRuleStatusVec(buf,8,err);
            
            if(err == U_BUFFER_OVERFLOW_ERROR) {
                buf=&buffer.front();
                buffer.resize(n,0);
                n = rbbi->getRuleStatusVec(buf,buffer.size(),err);
            }

            check_and_throw_icu_error(err);

            for(int i=0;i<n;i++) {
                switch(t) {
                case word:
                    if(UBRK_WORD_NONE<=buf[i] && buf[i]<UBRK_WORD_NONE_LIMIT)
                        indx.back().rule |= word_none;
                    else if(UBRK_WORD_NUMBER<=buf[i] && buf[i]<UBRK_WORD_NUMBER_LIMIT)
                        indx.back().rule |= word_number;
                    else if(UBRK_WORD_LETTER<=buf[i] && buf[i]<UBRK_WORD_LETTER_LIMIT)
                        indx.back().rule |= word_letter;
                    else if(UBRK_WORD_KANA<=buf[i] && buf[i]<UBRK_WORD_KANA_LIMIT)
                        indx.back().rule |= word_kana;
                    else if(UBRK_WORD_IDEO<=buf[i] && buf[i]<UBRK_WORD_IDEO_LIMIT)
                        indx.back().rule |= word_ideo;
                    break;

                case line:
                    if(UBRK_LINE_SOFT<=buf[i] && buf[i]<UBRK_LINE_SOFT_LIMIT)
                        indx.back().rule |= line_soft;
                    else if(UBRK_LINE_HARD<=buf[i] && buf[i]<UBRK_LINE_HARD_LIMIT)
                        indx.back().rule |= line_hard;
                    break;

                case sentence:
                    if(UBRK_SENTENCE_TERM<=buf[i] && buf[i]<UBRK_SENTENCE_TERM_LIMIT)
                        indx.back().rule |= sentence_term;
                    else if(UBRK_SENTENCE_SEP<=buf[i] && buf[i]<UBRK_SENTENCE_SEP_LIMIT)
                        indx.back().rule |= sentence_sep;
                    break;
                default:
                    ;
                }
            }
        }
        else {
            indx.back().rule |=character_any; // Baisc mark... for character
        }
    }
    return indx;
}